

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::detail::fwrite_all(void *ptr,size_t count,FILE *stream)

{
  format_string<> fmt;
  char *pcVar1;
  undefined8 uVar2;
  FILE *in_RDX;
  char *in_RSI;
  void *in_RDI;
  basic_string_view<char> bVar3;
  size_t written;
  int unused;
  string_view sv;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff00;
  format_string_checker<char,_0,_0,_false> *in_stack_ffffffffffffff20;
  basic_string_view<char> in_stack_ffffffffffffff28;
  undefined1 local_c8 [12];
  int error_code;
  format_string_checker<char,_0,_0,_false> local_88;
  basic_string_view<char> local_48;
  int local_30 [2];
  basic_string_view<char> local_28;
  undefined1 *local_10;
  undefined1 *local_8;
  
  pcVar1 = (char *)fwrite(in_RDI,1,(size_t)in_RSI,in_RDX);
  if (pcVar1 < in_RSI) {
    uVar2 = __cxa_allocate_exception(0x20);
    __errno_location();
    fwrite_all::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffff00);
    local_8 = local_c8;
    local_10 = &stack0xffffffffffffff37;
    bVar3 = v11::operator()((FMT_COMPILE_STRING *)0x2a41fe);
    error_code = bVar3.size_._4_4_;
    local_48 = v11::operator()((FMT_COMPILE_STRING *)0x2a422d);
    local_28 = local_48;
    format_string_checker<char,_0,_0,_false>::format_string_checker<>
              (&local_88,local_48.data_,local_48.size_);
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,0,0,false>>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    local_30[0] = 0;
    ignore_unused<int>(local_30);
    fmt.str.size_ = (size_t)in_RDX;
    fmt.str.data_ = pcVar1;
    system_error<>(error_code,fmt);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

inline void fwrite_all(const void* ptr, size_t count, FILE* stream) {
  size_t written = std::fwrite(ptr, 1, count, stream);
  if (written < count)
    FMT_THROW(system_error(errno, FMT_STRING("cannot write to file")));
}